

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::dht_direct_response_alert::response
          (bdecode_node *__return_storage_ptr__,dht_direct_response_alert *this)

{
  stack_allocator *this_00;
  char *start_00;
  undefined1 local_40 [8];
  error_code ec;
  char *end;
  char *start;
  dht_direct_response_alert *this_local;
  bdecode_node *ret;
  
  if (this->m_response_size == 0) {
    memset(__return_storage_ptr__,0,0x40);
    bdecode_node::bdecode_node(__return_storage_ptr__);
  }
  else {
    this_00 = std::reference_wrapper<libtorrent::aux::stack_allocator>::get(&this->m_alloc);
    start_00 = libtorrent::aux::stack_allocator::ptr
                         (this_00,(allocation_slot)(this->m_response_idx).m_idx);
    ec.cat_ = (error_category *)(start_00 + this->m_response_size);
    boost::system::error_code::error_code((error_code *)local_40);
    bdecode_node::bdecode_node(__return_storage_ptr__);
    bdecode(start_00,(char *)ec.cat_,__return_storage_ptr__,(error_code *)local_40,(int *)0x0,100,
            2000000);
  }
  return __return_storage_ptr__;
}

Assistant:

bdecode_node dht_direct_response_alert::response() const
	{
		if (m_response_size == 0) return bdecode_node();
		char const* start = m_alloc.get().ptr(m_response_idx);
		char const* end = start + m_response_size;
		error_code ec;
		bdecode_node ret;
		bdecode(start, end, ret, ec);
		TORRENT_ASSERT(!ec);
		return ret;
	}